

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O2

Am_Slot_Demon * __thiscall Am_Demon_Set::Get_Slot_Demon(Am_Demon_Set *this,unsigned_short which_bit)

{
  Am_Demon_Set_Data *pAVar1;
  Slot_Demon_Holder *pSVar2;
  long lVar3;
  Slot_Demon_Holder *pSVar4;
  Slot_Demon_Holder *pSVar5;
  
  pAVar1 = this->data;
  lVar3 = (ulong)pAVar1->invalid_length + 1;
  pSVar4 = pAVar1->change_demons + 4;
  while (lVar3 = lVar3 + -1, lVar3 != 0) {
    pSVar5 = pSVar4 + 1;
    pSVar2 = pSVar4 + 1;
    pSVar4 = pSVar5;
    if (pSVar2->which_bit == which_bit) goto LAB_001d18a7;
  }
  lVar3 = (ulong)pAVar1->change_length + 1;
  pSVar4 = (Slot_Demon_Holder *)&pAVar1->add_part_demon;
  do {
    lVar3 = lVar3 + -1;
    if (lVar3 == 0) {
      return (Am_Slot_Demon *)0x0;
    }
    pSVar5 = pSVar4 + 1;
    pSVar2 = pSVar4 + 1;
    pSVar4 = pSVar5;
  } while (pSVar2->which_bit != which_bit);
LAB_001d18a7:
  return pSVar5->demon;
}

Assistant:

Am_Slot_Demon *
Am_Demon_Set::Get_Slot_Demon(unsigned short which_bit) const
{
  int i;
  for (i = 0; i < data->invalid_length; ++i)
    if (data->invalid_demons[i].which_bit == which_bit)
      return data->invalid_demons[i].demon;
  for (i = 0; i < data->change_length; ++i)
    if (data->change_demons[i].which_bit == which_bit)
      return data->change_demons[i].demon;
  return nullptr;
}